

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O2

void aes_cbc_sw_encrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  ssh_cipher *vout;
  ssh_cipheralg *psVar1;
  ssh_cipheralg *psVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  undefined8 *puVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ssh_cipher *vp;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint64_t i0;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint64_t i1;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint8_t *p;
  uint local_a4;
  ushort local_9c;
  ushort local_98;
  int local_88;
  ushort *local_70;
  
  puVar14 = (undefined8 *)((long)blklen + (long)vblk);
  vout = ciph + -0xb;
  for (; vblk < puVar14; vblk = (void *)((long)vblk + 0x10)) {
    memxor16(vout,vout,vblk);
    psVar1 = ciph[-0xb].vt;
    psVar2 = ciph[-10].vt;
    uVar16 = (((ulong)psVar1 >> 7 ^ (ulong)psVar1) & 0xaa00aa00aa00aa) * 0x81 ^ (ulong)psVar1;
    uVar10 = (((ulong)psVar2 >> 7 ^ (ulong)psVar2) & 0xaa00aa00aa00aa) * 0x81 ^ (ulong)psVar2;
    uVar16 = ((uVar16 >> 0xe ^ uVar16) & 0xcccc0000cccc) * 0x4001 ^ uVar16;
    uVar10 = ((uVar10 >> 0xe ^ uVar10) & 0xcccc0000cccc) * 0x4001 ^ uVar10;
    uVar16 = (ulong)(((uint)(uVar16 >> 0x1c) ^ (uint)uVar16) & 0xf0f0f0f0) * 0x10000001 ^ uVar16;
    uVar10 = (ulong)(((uint)(uVar10 >> 0x1c) ^ (uint)uVar10) & 0xf0f0f0f0) * 0x10000001 ^ uVar10;
    uVar11 = (uVar16 >> 8 ^ uVar10) & 0xff00ff00ff00ff;
    uVar16 = uVar11 << 8 ^ uVar16;
    uVar11 = uVar11 ^ uVar10;
    uVar9 = (uint)(ushort)(*(ushort *)&ciph[-0x2a].vt ^ (ushort)uVar16);
    uVar15 = (uint)(ushort)((ushort)(uVar16 >> 0x10) ^ *(ushort *)((long)&ciph[-0x2a].vt + 4));
    uVar7 = (uint)(ushort)((ushort)(uVar11 >> 0x10) ^ *(ushort *)((long)&ciph[-0x2a].vt + 6));
    uVar3 = (ushort)(uVar16 >> 0x30);
    uVar8 = CONCAT22(uVar3,(ushort)(uVar16 >> 0x20) ^ *(ushort *)&ciph[-0x29].vt);
    uVar4 = (ushort)(uVar11 >> 0x30);
    uVar20 = CONCAT22(uVar4,(ushort)(uVar11 >> 0x20) ^ *(ushort *)((long)&ciph[-0x29].vt + 2));
    uVar37 = (uint)(uVar3 ^ *(ushort *)((long)&ciph[-0x29].vt + 4));
    uVar13 = (uint)(uVar4 ^ *(ushort *)((long)&ciph[-0x29].vt + 6));
    local_a4 = (uint)(ushort)(*(ushort *)((long)&ciph[-0x2a].vt + 2) ^ (ushort)uVar11);
    local_88 = *(int *)&ciph[-0xc].vt;
    local_70 = (ushort *)((long)&ciph[-0x27].vt + 6);
    while( true ) {
      local_88 = local_88 + -1;
      uVar6 = uVar15 ^ uVar8;
      uVar17 = local_a4 ^ uVar13;
      uVar31 = uVar15 ^ uVar13;
      uVar20 = uVar20 ^ uVar37;
      uVar18 = uVar9 ^ uVar20;
      uVar21 = uVar8 ^ uVar13;
      uVar25 = uVar17 ^ uVar6;
      uVar15 = uVar15 ^ uVar7 ^ uVar25;
      uVar37 = uVar7 ^ uVar25 ^ uVar37;
      uVar28 = uVar15 ^ uVar20;
      uVar22 = uVar37 ^ uVar21;
      uVar12 = (uVar28 ^ uVar22) & uVar6 ^ uVar22 & uVar21;
      uVar7 = uVar28 & uVar31 ^ uVar22 & uVar21;
      local_a4 = local_a4 ^ uVar18;
      uVar20 = uVar20 ^ uVar22;
      uVar38 = uVar37 ^ uVar15 & uVar25 ^ (uVar15 ^ uVar9) & (local_a4 ^ uVar31) ^ uVar12;
      uVar12 = local_a4 & uVar18 ^ uVar20 ^ uVar20 & uVar17 ^ uVar17 ^ uVar12;
      uVar26 = (uVar18 ^ uVar8) & uVar9 ^ uVar31 ^ uVar28 ^ uVar15 & uVar25 ^ uVar7;
      uVar7 = uVar20 & uVar17 ^ uVar13 ^ (uVar22 ^ uVar9) & (uVar18 ^ uVar13) ^ uVar20 ^ uVar7;
      uVar37 = uVar12 & uVar38;
      uVar38 = uVar38 ^ uVar26;
      uVar33 = (uVar7 ^ uVar37) & uVar38 ^ uVar26;
      uVar27 = (uVar26 ^ uVar37) & (uVar7 ^ uVar12);
      uVar26 = uVar27 ^ uVar7;
      uVar27 = (uVar27 ^ uVar37) & uVar7;
      uVar12 = uVar12 ^ uVar27;
      uVar38 = (uVar27 ^ uVar7 ^ uVar37) & uVar33 ^ uVar38;
      uVar39 = uVar12 ^ uVar26;
      uVar37 = uVar38 ^ uVar39;
      uVar40 = uVar39 & (local_a4 ^ uVar31);
      uVar20 = uVar20 & (uVar38 ^ uVar33);
      uVar17 = (uVar38 ^ uVar33) & uVar17;
      uVar30 = (uVar22 ^ uVar9) & uVar33;
      uVar32 = uVar33 ^ uVar26;
      uVar19 = uVar15 & uVar12 ^ uVar20;
      uVar6 = uVar6 & (uVar37 ^ uVar32);
      uVar21 = uVar32 & uVar21 ^ uVar6;
      uVar7 = uVar38 & local_a4 ^ uVar30;
      uVar27 = uVar21 ^ uVar18 & uVar38;
      local_98 = (ushort)uVar9;
      uVar10 = ((ulong)(uVar28 ^ uVar22) & 0xffffffff0000ffff | (ulong)local_98 << 0x10) &
               ((ulong)(uVar37 ^ uVar32) & 0xffffffff0000ffff | (ulong)(ushort)uVar26 << 0x10);
      uVar23 = uVar17 ^ uVar19 ^ (uint)(ushort)(uVar10 >> 0x10);
      uVar11 = ((ulong)(uVar22 & uVar32 ^ uVar20) & 0xffffffff0000ffff |
               (ulong)(ushort)uVar30 << 0x10) ^ uVar10;
      uVar29 = uVar28 & uVar37 ^ uVar27 ^ (uint)uVar10;
      uVar27 = uVar27 ^ uVar40 ^ uVar12 & uVar25;
      uVar20 = (uint)uVar11 ^ uVar18 & uVar38;
      uVar34 = uVar33 & (uVar18 ^ uVar13) ^ uVar29 ^ uVar23;
      uVar13 = (uVar15 ^ uVar9) & uVar39 ^ uVar27;
      uVar29 = uVar29 ^ uVar17 ^ uVar7;
      uVar23 = uVar7 ^ uVar21 ^ uVar23;
      uVar19 = uVar19 ^ uVar13;
      uVar41 = (uVar18 ^ uVar8) & uVar26 ^ uVar40 ^ uVar34;
      uVar39 = uVar19 ^ uVar20;
      uVar34 = uVar20 ^ uVar37 & uVar31 ^ uVar6 ^ uVar34;
      uVar31 = ((uVar23 >> 8 ^ uVar23) & 0xcc) * 0x101 ^ uVar23;
      uVar8 = uVar31 >> 4 & 0xaaa;
      uVar6 = (uVar31 & 10) << 0xc;
      uVar22 = uVar31 & 0x5555 | uVar6 | uVar8;
      uVar28 = ((uVar29 >> 8 ^ uVar29) & 0xcc) * 0x101 ^ uVar29;
      uVar20 = uVar28 >> 4 & 0xaaa;
      uVar12 = (uVar28 & 10) << 0xc;
      uVar30 = uVar28 & 0x5555 | uVar12 | uVar20;
      uVar35 = ((uVar41 >> 8 ^ uVar41) & 0xcc) * 0x101 ^ uVar41;
      uVar15 = uVar35 >> 4 & 0xaaa;
      uVar26 = (uVar35 & 10) << 0xc;
      uVar36 = uVar35 & 0x5555 | uVar26 | uVar15;
      uVar32 = ((uVar19 >> 8 ^ uVar19) & 0xcc) * 0x101 ^ uVar19;
      uVar37 = uVar32 >> 4 & 0xaaa;
      uVar17 = (uVar32 & 10) << 0xc;
      uVar33 = uVar32 & 0x5555 | uVar17 | uVar37;
      uVar40 = ((uVar34 >> 8 ^ uVar34) & 0xcc) * 0x101 ^ uVar34;
      uVar9 = uVar40 >> 4 & 0xaaa;
      uVar18 = (uVar40 & 10) << 0xc;
      uVar24 = uVar40 & 0x5555 | uVar18 | uVar9;
      uVar25 = ((uVar39 >> 8 ^ uVar39) & 0xcc) * 0x101 ^ uVar39;
      uVar21 = (uVar25 & 10) << 0xc;
      uVar7 = uVar25 >> 4 & 0xaaa;
      uVar38 = uVar25 & 0x5555 | uVar21 | uVar7;
      local_9c = (ushort)uVar13;
      uVar11 = ((ulong)uVar27 & 0xffffffff0000ffff | (ulong)local_9c << 0x10) ^ uVar11;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar11;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = CONCAT22((ushort)(uVar11 >> 0x10) >> 8,(ushort)uVar11 >> 8) ^ uVar11;
      auVar42 = ZEXT416(CONCAT22(SUB162(auVar42 & _DAT_00124bc0,2) * 0x101,
                                 SUB162(auVar42 & _DAT_00124bc0,0) * 0x101)) ^ auVar43;
      auVar44._0_2_ = auVar42._0_2_ >> 4;
      auVar44._2_2_ = auVar42._2_2_ >> 4;
      auVar44._4_4_ = 0;
      auVar44._8_2_ = auVar42._8_2_ >> 4;
      auVar44._10_2_ = auVar42._10_2_ >> 4;
      auVar44._12_2_ = auVar42._12_2_ >> 4;
      auVar44._14_2_ = auVar42._14_2_ >> 4;
      auVar45 = psllw(auVar42,0xc);
      auVar42 = auVar42 & _DAT_00124c00 | auVar45 & _DAT_00124bf0 | auVar44 & _DAT_00124be0;
      if (local_88 == 0) break;
      uVar13 = ((uVar31 & 0x4444 | uVar6 | uVar8) >> 1) + (uVar23 & 0xfffff111) * 8;
      uVar22 = uVar22 ^ uVar13;
      uVar20 = ((uVar28 & 0x4444 | uVar12 | uVar20) >> 1) + (uVar29 & 0xfffff111) * 8;
      uVar30 = uVar30 ^ uVar20;
      uVar15 = ((uVar35 & 0x4444 | uVar26 | uVar15) >> 1) + (uVar41 & 0xfffff111) * 8;
      uVar36 = uVar36 ^ uVar15;
      auVar44 = psllw(auVar43,3);
      auVar45._0_2_ = auVar42._0_2_ >> 1;
      auVar45._2_2_ = auVar42._2_2_ >> 1;
      auVar45._4_4_ = 0;
      auVar45._8_2_ = auVar42._8_2_ >> 1;
      auVar45._10_2_ = auVar42._10_2_ >> 1;
      auVar45._12_2_ = auVar42._12_2_ >> 1;
      auVar45._14_2_ = auVar42._14_2_ >> 1;
      auVar44 = auVar45 & _DAT_00124c20 | auVar44 & _DAT_00124c10;
      uVar8 = ((uVar32 & 0x4444 | uVar17 | uVar37) >> 1) + (uVar19 & 0xfffff111) * 8;
      uVar33 = uVar33 ^ uVar8;
      uVar37 = ((uVar40 & 0x4444 | uVar18 | uVar9) >> 1) + (uVar34 & 0xfffff111) * 8;
      uVar24 = uVar24 ^ uVar37;
      uVar6 = ((uVar25 & 0x4444 | uVar21 | uVar7) >> 1) + (uVar39 & 0xfffff111) * 8;
      uVar3 = SUB162(auVar42 ^ auVar44,2);
      uVar12 = SUB164(auVar42 ^ auVar44,0);
      uVar8 = (ushort)((ushort)((uVar33 >> 2 & 0x3333) + (uVar33 & 0x3333) * 4) ^ local_70[-3]) ^
              uVar8 ^ uVar12 ^ (uint)uVar3;
      uVar38 = uVar38 ^ uVar6;
      uVar9 = (ushort)((ushort)((uVar22 >> 2 & 0x3333) + (uVar22 & 0x3333) * 4) ^ local_70[-7]) ^
              uVar13 ^ uVar12;
      local_a4 = uVar22 ^ uVar20 ^
                 (uint)(ushort)((ushort)((uVar30 >> 2 & 0x3333) + (uVar30 & 0x3333) * 4) ^
                               local_70[-6]) ^ uVar12;
      uVar15 = uVar30 ^ uVar15 ^
               (uint)(ushort)((ushort)((uVar36 >> 2 & 0x3333) + (uVar36 & 0x3333) * 4) ^
                             local_70[-5]);
      uVar7 = auVar44._2_2_ ^ uVar12 ^ uVar36 ^
              (uint)(ushort)((uVar3 >> 2 & 0x3333) + (uVar3 & 0x3333) * 4 ^ local_70[-4]);
      uVar20 = uVar33 ^ uVar37 ^
               (uint)(ushort)((ushort)((uVar24 >> 2 & 0x3333) + (uVar24 & 0x3333) * 4) ^
                             local_70[-2]);
      uVar37 = uVar24 ^ uVar6 ^
               (uint)(ushort)((ushort)((uVar38 >> 2 & 0x3333) + (uVar38 & 0x3333) * 4) ^
                             local_70[-1]);
      uVar13 = auVar44._0_4_ ^ uVar38 ^
               (uint)(ushort)((ushort)((uVar12 >> 2 & 0x3333) + (uVar12 & 0x3333) * 4) ^ *local_70);
      local_70 = local_70 + 8;
    }
    uVar10 = CONCAT62(CONCAT42(CONCAT22(auVar42._0_2_ ^ *local_70,(ushort)uVar24 ^ local_70[-2]),
                               auVar42._2_2_ ^ local_70[-4]),(ushort)uVar30 ^ local_70[-6]);
    uVar11 = CONCAT62(CONCAT42(CONCAT22((ushort)uVar38 ^ local_70[-1],(ushort)uVar33 ^ local_70[-3])
                               ,(ushort)uVar36 ^ local_70[-5]),(ushort)uVar22 ^ local_70[-7]);
    uVar16 = (uVar11 >> 8 ^ uVar10) & 0xff00ff00ff00ff;
    uVar11 = uVar16 << 8 ^ uVar11;
    uVar16 = uVar16 ^ uVar10;
    uVar11 = (ulong)(((uint)(uVar11 >> 0x1c) ^ (uint)uVar11) & 0xf0f0f0f0) * 0x10000001 ^ uVar11;
    uVar16 = (ulong)(((uint)(uVar16 >> 0x1c) ^ (uint)uVar16) & 0xf0f0f0f0) * 0x10000001 ^ uVar16;
    uVar11 = ((uVar11 >> 0xe ^ uVar11) & 0xcccc0000cccc) * 0x4001 ^ uVar11;
    uVar16 = ((uVar16 >> 0xe ^ uVar16) & 0xcccc0000cccc) * 0x4001 ^ uVar16;
    bVar5 = true;
    vp = vout;
    while (bVar5) {
      PUT_64BIT_LSB_FIRST(vp,((uVar11 >> 7 ^ uVar11) & 0xaa00aa00aa00aa) * 0x81 ^ uVar11);
      PUT_64BIT_LSB_FIRST(vp + 1,((uVar16 >> 7 ^ uVar16) & 0xaa00aa00aa00aa) * 0x81 ^ uVar16);
      vp = vp + 2;
      bVar5 = false;
    }
    psVar1 = ciph[-10].vt;
    *(ssh_cipheralg **)vblk = vout->vt;
    *(ssh_cipheralg **)((long)vblk + 8) = psVar1;
  }
  return;
}

Assistant:

static inline void aes_cbc_sw_encrypt(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);

    /*
     * CBC encryption has to be done serially, because the input to
     * each run of the cipher includes the output from the previous
     * run.
     */

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        /*
         * We use the IV array itself as the location for the
         * encryption, because there's no reason not to.
         */

        /* XOR the new plaintext block into the previous cipher block */
        memxor16(ctx->iv.cbc.prevblk, ctx->iv.cbc.prevblk, blk);

        /* Run the cipher over the result, which leaves it
         * conveniently already stored in ctx->iv */
        aes_sliced_e_serial(
            ctx->iv.cbc.prevblk, ctx->iv.cbc.prevblk, &ctx->sk);

        /* Copy it to the output location */
        memcpy(blk, ctx->iv.cbc.prevblk, 16);
    }
}